

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

void ft_gzip_stream_close(FT_Stream stream)

{
  FT_GZipFile zip_00;
  FT_Memory memory_00;
  FT_Memory memory;
  FT_GZipFile zip;
  FT_Stream stream_local;
  
  zip_00 = (FT_GZipFile)(stream->descriptor).pointer;
  memory_00 = stream->memory;
  if (zip_00 != (FT_GZipFile)0x0) {
    ft_gzip_file_done(zip_00);
    ft_mem_free(memory_00,zip_00);
    (stream->descriptor).value = 0;
  }
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    ft_mem_free(memory_00,stream->base);
    stream->base = (uchar *)0x0;
  }
  return;
}

Assistant:

static void
  ft_gzip_stream_close( FT_Stream  stream )
  {
    FT_GZipFile  zip    = (FT_GZipFile)stream->descriptor.pointer;
    FT_Memory    memory = stream->memory;


    if ( zip )
    {
      /* finalize gzip file descriptor */
      ft_gzip_file_done( zip );

      FT_FREE( zip );

      stream->descriptor.pointer = NULL;
    }

    if ( !stream->read )
      FT_FREE( stream->base );
  }